

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O0

void png_read_filter_row_sub4_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  __m128i alVar1;
  __m128i d;
  __m128i a;
  size_t rb;
  png_const_bytep prev_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  prev_local = row;
  for (a[1] = row_info->rowbytes + 4; 4 < (ulong)a[1]; a[1] = a[1] + -4) {
    alVar1 = load4(prev_local);
    alVar1[0] = (longlong)row;
    store4(prev_local,alVar1);
    prev_local = prev_local + 4;
  }
  return;
}

Assistant:

void png_read_filter_row_sub4_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* The Sub filter predicts each pixel as the previous pixel, a.
    * There is no pixel to the left of the first pixel.  It's encoded directly.
    * That works with our main loop if we just say that left pixel was zero.
    */
   size_t rb;

   __m128i a, d = _mm_setzero_si128();

   png_debug(1, "in png_read_filter_row_sub4_sse2");

   rb = row_info->rowbytes+4;
   while (rb > 4) {
      a = d; d = load4(row);
      d = _mm_add_epi8(d, a);
      store4(row, d);

      row += 4;
      rb  -= 4;
   }
   PNG_UNUSED(prev)
}